

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *args_2;
  ParameterPortListSyntax *pPVar1;
  Token local_58;
  Token local_48;
  Token local_38;
  
  local_38 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_48 = parsing::Token::deepClone((Token *)(__fn + 0x28),(BumpAllocator *)__child_stack);
  args_2 = deepClone<slang::syntax::ParameterDeclarationBaseSyntax>
                     ((SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax> *)
                      (__fn + 0x38),(BumpAllocator *)__child_stack);
  local_58 = parsing::Token::deepClone((Token *)(__fn + 0x70),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ParameterPortListSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ParameterDeclarationBaseSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,&local_38,&local_48,args_2,&local_58);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ParameterPortListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ParameterPortListSyntax>(
        node.hash.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone(node.declarations, alloc),
        node.closeParen.deepClone(alloc)
    );
}